

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * __thiscall
absl::cord_internal::CordRepBtree::AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  string_view data_00;
  undefined1 auVar1 [12];
  bool bVar2;
  size_type sVar3;
  CordRepBtree *pCVar4;
  size_t sVar5;
  size_t sVar6;
  size_type sVar7;
  OpResult OVar8;
  string_view sVar9;
  string_view s;
  OpResult result_00;
  OpResult result_01;
  OpResult result_02;
  OpResult result_03;
  CordRepBtree *local_148;
  char *local_140;
  OpResult result_1;
  size_t delta;
  CordRepBtree *local_d0;
  char *local_c8;
  OpResult result;
  CordRepBtree *leaf;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> ops;
  int depth;
  size_t original_data_size;
  size_t extra_local;
  CordRepBtree *tree_local;
  string_view data_local;
  
  data_local._M_len = data._M_len;
  tree_local = tree;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&tree_local);
  data_local._M_str = (char *)this;
  if (!bVar2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&tree_local);
    ops.stack[0xb]._4_4_ = height(this);
    pCVar4 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
             BuildStack((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)&leaf,
                        this,ops.stack[0xb]._4_4_);
    sVar5 = size(pCVar4);
    sVar6 = capacity(pCVar4);
    extra_local = (size_t)this;
    if (sVar5 < sVar6) {
      bVar2 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::owned
                        ((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)&leaf,
                         ops.stack[0xb]._4_4_);
      OVar8 = ToOpResult(pCVar4,bVar2);
      pCVar4 = OVar8.tree;
      sVar9._M_str = (char *)data_local._M_len;
      sVar9._M_len = (size_t)tree_local;
      sVar9 = AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
                        (pCVar4,sVar9,(size_t)data._M_str);
      local_d0 = (CordRepBtree *)sVar9._M_len;
      tree_local = local_d0;
      local_c8 = sVar9._M_str;
      data_local._M_len = (size_t)local_c8;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&tree_local);
      auVar1 = OVar8._0_12_;
      if (bVar2) {
        (pCVar4->super_CordRep).length = sVar3 + (pCVar4->super_CordRep).length;
        result_00._12_4_ = 0;
        result_00.tree = (CordRepBtree *)auVar1._0_8_;
        result_00.action = auVar1._8_4_;
        pCVar4 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
                 Unwind<false>((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)
                               &leaf,this,ops.stack[0xb]._4_4_,sVar3,result_00);
        return pCVar4;
      }
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&tree_local);
      sVar5 = sVar3 - sVar7;
      if (sVar5 == 0) {
        __assert_fail("delta > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x275,
                      "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                     );
      }
      (pCVar4->super_CordRep).length = sVar5 + (pCVar4->super_CordRep).length;
      result_01._12_4_ = 0;
      result_01.tree = (CordRepBtree *)auVar1._0_8_;
      result_01.action = auVar1._8_4_;
      extra_local = (size_t)anon_unknown_0::
                            StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
                            Propagate((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                       *)&leaf,this,ops.stack[0xb]._4_4_,sVar5,result_01);
      leaf._0_4_ = ops.stack[0xb]._4_4_ + 1;
    }
    while( true ) {
      data_00._M_str = (char *)data_local._M_len;
      data_00._M_len = (size_t)tree_local;
      pCVar4 = NewLeaf<(absl::cord_internal::CordRepBtree::EdgeType)1>(data_00,(size_t)data._M_str);
      sVar5 = (pCVar4->super_CordRep).length;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&tree_local);
      if (sVar5 == sVar3) break;
      s._M_str = (char *)(pCVar4->super_CordRep).length;
      s._M_len = data_local._M_len;
      sVar9 = anon_unknown_0::Consume<(absl::cord_internal::CordRepBtree::EdgeType)1>
                        ((anon_unknown_0 *)tree_local,s,sVar3);
      local_148 = (CordRepBtree *)sVar9._M_len;
      tree_local = local_148;
      local_140 = sVar9._M_str;
      data_local._M_len = (size_t)local_140;
      result_03.action = 2;
      result_03.tree = pCVar4;
      result_03._12_4_ = 0;
      extra_local = (size_t)anon_unknown_0::
                            StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
                            Unwind<false>((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                           *)&leaf,(CordRepBtree *)extra_local,ops.stack[0xb]._4_4_,
                                          (pCVar4->super_CordRep).length,result_03);
      ops.stack[0xb]._4_4_ = height((CordRepBtree *)extra_local);
      anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
      BuildOwnedStack((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)&leaf,
                      (CordRepBtree *)extra_local,ops.stack[0xb]._4_4_);
    }
    result_02.action = 2;
    result_02.tree = pCVar4;
    result_02._12_4_ = 0;
    data_local._M_str =
         (char *)anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
                 Unwind<false>((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)
                               &leaf,(CordRepBtree *)extra_local,ops.stack[0xb]._4_4_,
                               (pCVar4->super_CordRep).length,result_02);
  }
  return (CordRepBtree *)data_local._M_str;
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}